

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandMiter2(Abc_Frame_t *pAbc,int argc,char **argv)

{
  char *pFileName_00;
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Vec_Ptr_t *vNodes_00;
  int fVerbose;
  int c;
  char *pFileName;
  Vec_Ptr_t *vNodes;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"vh"), iVar1 != -1) {
    if ((iVar1 == 0x68) || (iVar1 != 0x76)) {
      Abc_Print(-2,"usage: miter2 [-h] <file>\n");
      Abc_Print(-2,"\t         derives specialized miter\n");
      Abc_Print(-2,"\t-h     : print the command usage\n");
      Abc_Print(-2,"\t<file> : file name with node names\n");
      return 1;
    }
  }
  if (argc != globalUtilOptind + 1) {
    Abc_Print(-1,"The file with node names is not given.\n");
    return 1;
  }
  iVar1 = Abc_NtkIsLogic(pAVar2);
  if (iVar1 == 0) {
    Abc_Print(-1,"The base network should be logic network from BLIF file.\n");
    return 1;
  }
  pFileName_00 = argv[globalUtilOptind];
  vNodes_00 = Abc_NtkReadNodeNames(pAVar2,pFileName_00);
  if (vNodes_00 == (Vec_Ptr_t *)0x0) {
    Abc_Print(-1,"Cannot read node names from file \"%s\".\n",pFileName_00);
    return 1;
  }
  pAVar2 = Abc_NtkSpecialMiter(pAVar2,vNodes_00);
  Vec_PtrFree(vNodes_00);
  Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
  return 0;
}

Assistant:

int Abc_CommandMiter2( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Vec_Ptr_t * Abc_NtkReadNodeNames( Abc_Ntk_t * pNtk, char * pFileName );
    extern Abc_Ntk_t * Abc_NtkSpecialMiter( Abc_Ntk_t * pNtk, Vec_Ptr_t * vNodes );

    Abc_Ntk_t * pNtk, * pNtkRes;
    Vec_Ptr_t * vNodes;
    char * pFileName;
    int c, fVerbose = 0;
    pNtk = Abc_FrameReadNtk(pAbc);

    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    // get the second network
    if ( argc != globalUtilOptind + 1 )
    {
        Abc_Print( -1, "The file with node names is not given.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "The base network should be logic network from BLIF file.\n" );
        return 1;
    }
    // read the second network
    pFileName = argv[globalUtilOptind];
    if ( (vNodes = Abc_NtkReadNodeNames(pNtk, pFileName)) == NULL )
    {
        Abc_Print( -1, "Cannot read node names from file \"%s\".\n", pFileName );
        return 1;
    }
    pNtkRes = Abc_NtkSpecialMiter( pNtk, vNodes );
    Vec_PtrFree( vNodes );
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: miter2 [-h] <file>\n" );
    Abc_Print( -2, "\t         derives specialized miter\n" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : file name with node names\n");
    return 1;
}